

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall argo::utf8::json_string_to_utf8(utf8 *this,string *src)

{
  undefined1 uVar1;
  size_t sVar2;
  char c_00;
  string *this_00;
  ulong uVar3;
  char *pcVar4;
  undefined1 *puVar5;
  json_utf8_exception *this_01;
  char c;
  allocator local_31;
  string *local_30;
  string *dst;
  size_t dst_index;
  size_t src_index;
  string *src_local;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  
  dst_index = 0;
  dst = (string *)0x0;
  src_index = (size_t)src;
  src_local = (string *)this;
  this_00 = (string *)operator_new(0x20);
  uVar3 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,uVar3,'\0',&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_30 = this_00;
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)this,
             (pointer)this_00);
  while (sVar2 = dst_index, uVar3 = std::__cxx11::string::size(), sVar2 < uVar3) {
    pcVar4 = (char *)std::__cxx11::string::operator[](src_index);
    if (*pcVar4 == '\\') {
      dst_index = dst_index + 1;
      c_00 = next_char((string *)src_index,&dst_index);
      switch(c_00) {
      case '\"':
      case '/':
      case '\\':
        dst = dst + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
        *pcVar4 = c_00;
        break;
      default:
        this_01 = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
        json_utf8_exception::json_utf8_exception(this_01,invalid_string_escape_e,c_00);
        __cxa_throw(this_01,&json_utf8_exception::typeinfo,json_utf8_exception::~json_utf8_exception
                   );
      case 'b':
        dst = dst + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
        *puVar5 = 8;
        break;
      case 'f':
        dst = dst + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
        *puVar5 = 0xc;
        break;
      case 'n':
        dst = dst + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
        *puVar5 = 10;
        break;
      case 'r':
        dst = dst + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
        *puVar5 = 0xd;
        break;
      case 't':
        dst = dst + 1;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
        *puVar5 = 9;
        break;
      case 'u':
        parse_unicode((string *)src_index,&dst_index,(string *)local_30,(size_t *)&dst);
      }
    }
    else {
      dst_index = dst_index + 1;
      puVar5 = (undefined1 *)std::__cxx11::string::operator[](src_index);
      uVar1 = *puVar5;
      dst = dst + 1;
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_30);
      *puVar5 = uVar1;
    }
  }
  std::__cxx11::string::resize((ulong)local_30);
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

unique_ptr<string> utf8::json_string_to_utf8(const string &src)
{
    size_t src_index = 0;
    size_t dst_index = 0;

    string *dst = new string(src.size(), '\0');

    unique_ptr<string> res(dst);

    while (src_index < src.size())
    {
        if (src[src_index] != '\\')
        {
            (*dst)[dst_index++] = src[src_index++];
        }
        else
        {
            char c = next_char(src, ++src_index);

            switch (c)
            {
            case '"':
            case '\\':
            case '/':
                (*dst)[dst_index++] = c;
                break;
            case 'b':
                (*dst)[dst_index++] = '\b';
                break;
            case 'f':
                (*dst)[dst_index++] = '\f';
                break;
            case 'n':
                (*dst)[dst_index++] = '\n';
                break;
            case 'r':
                (*dst)[dst_index++] = '\r';
                break;
            case 't':
                (*dst)[dst_index++] = '\t';
                break;
            case 'u':
                parse_unicode(src, src_index, *dst, dst_index);
                break;
            default: 
                throw json_utf8_exception(json_utf8_exception::invalid_string_escape_e, c);
            }
        }
    }

    dst->resize(dst_index);
    return res;
}